

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

hash_t JsUtil::
       BaseDictionary<Js::JavascriptString*,void*,Js::BranchDictionaryWrapper<Js::JavascriptString*>::DictAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,Js::BranchDictionaryWrapper<Js::JavascriptString*>::SimpleDictionaryEntryWithFixUp,JsUtil::NoResizeLock>
       ::GetHashCodeWithKey<Js::JavascriptString*>(JavascriptString **key)

{
  JavascriptString *this;
  charcount_t cVar1;
  hash_t hVar2;
  char16 *pcVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  this = *key;
  pcVar3 = Js::JavascriptString::GetString(this);
  cVar1 = Js::JavascriptString::GetLength(this);
  if (cVar1 == 0) {
    hVar2 = 0x2393b8b;
  }
  else {
    uVar5 = 0x811c9dc5;
    uVar4 = 0;
    do {
      uVar6 = (ushort)pcVar3[uVar4] ^ uVar5;
      uVar5 = uVar6 * 0x1000193;
      uVar4 = uVar4 + 1;
    } while (cVar1 != uVar4);
    hVar2 = uVar6 * 0x2000326 + 1;
  }
  return hVar2;
}

Assistant:

static hash_t GetHashCodeWithKey(const TLookup& key)
        {
            // set last bit to 1 to avoid false positive to make hash appears to be a valid recycler address.
            // In the same line, 0 should be use to indicate a non-existing entry.
            return TAGHASH(Comparer<TLookup>::GetHashCode(key));
        }